

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O2

void __thiscall soplex::SoPlexBase<double>::_verifySolutionReal(SoPlexBase<double> *this)

{
  Verbosity VVar1;
  double dVar2;
  double dVar3;
  SPxOut *pSVar4;
  SPxOut *pSVar5;
  Verbosity old_verbosity;
  Real RVar6;
  double redcostviol;
  double dualviol;
  double rowviol;
  double boundviol;
  double sumviol;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  pSVar5 = &this->spxout;
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    pSVar4 = soplex::operator<<(pSVar5," --- verifying computed solution");
    std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
    (this->spxout).m_verbosity = VVar1;
  }
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = 0.0;
  local_50 = 0.0;
  local_58 = 0.0;
  getBoundViolation(this,&local_40,&local_38);
  getRowViolation(this,&local_48,&local_38);
  getDualViolation(this,&local_50,&local_38);
  getRedCostViolation(this,&local_58,&local_38);
  dVar3 = local_40;
  RVar6 = Tolerances::floatingPointFeastol
                    ((this->_solver).super_SPxLPBase<double>._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  dVar2 = local_48;
  if ((((dVar3 < RVar6) &&
       (RVar6 = Tolerances::floatingPointFeastol
                          ((this->_solver).super_SPxLPBase<double>._tolerances.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ), dVar3 = local_50, dVar2 < RVar6)) &&
      (RVar6 = Tolerances::floatingPointOpttol
                         ((this->_solver).super_SPxLPBase<double>._tolerances.
                          super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      , dVar2 = local_58, dVar3 < RVar6)) &&
     (RVar6 = Tolerances::floatingPointOpttol
                        ((this->_solver).super_SPxLPBase<double>._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
     dVar2 < RVar6)) {
    return;
  }
  VVar1 = (this->spxout).m_verbosity;
  if ((int)VVar1 < 5) {
    if ((int)VVar1 < 3) goto LAB_002bd699;
  }
  else {
    (this->spxout).m_verbosity = INFO3;
    pSVar4 = soplex::operator<<(pSVar5,"bound violation: ");
    pSVar4 = soplex::operator<<(pSVar4,local_40);
    pSVar4 = soplex::operator<<(pSVar4,", row violation: ");
    pSVar4 = soplex::operator<<(pSVar4,local_48);
    pSVar4 = soplex::operator<<(pSVar4,", dual violation: ");
    pSVar4 = soplex::operator<<(pSVar4,local_50);
    pSVar4 = soplex::operator<<(pSVar4,", redcost violation: ");
    pSVar4 = soplex::operator<<(pSVar4,local_58);
    std::endl<char,std::char_traits<char>>(pSVar4->m_streams[pSVar4->m_verbosity]);
  }
  (this->spxout).m_verbosity = INFO1;
  pSVar5 = soplex::operator<<(pSVar5,
                              " --- detected violations in original problem space -- solve again without presolving/scaling"
                             );
  std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
  (this->spxout).m_verbosity = VVar1;
LAB_002bd699:
  if (this->_isRealLPScaled == true) {
    SPxSolverBase<double>::unscaleLPandReloadBasis(&this->_solver);
    this->_isRealLPScaled = false;
    this->_unscaleCalls = this->_unscaleCalls + 1;
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_verifySolutionReal()
{
   assert(_hasSolReal);

   SPX_MSG_INFO1(spxout, spxout << " --- verifying computed solution" << std::endl;)

   R sumviol = 0;
   R boundviol = 0;
   R rowviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   (void) getBoundViolation(boundviol, sumviol);
   (void) getRowViolation(rowviol, sumviol);
   (void) getDualViolation(dualviol, sumviol);
   (void) getRedCostViolation(redcostviol, sumviol);

   if(boundviol >= _solver.tolerances()->floatingPointFeastol()
         || rowviol >= _solver.tolerances()->floatingPointFeastol()
         || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << "bound violation: " << boundviol
                    << ", row violation: " << rowviol
                    << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}